

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Profile.cpp
# Opt level: O0

statHashKey_t * __thiscall
Profile::__staticHashKey(Profile *this,vector<void_*,_std::allocator<void_*>_> *btVec)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  basic_ostream<char,_std::char_traits<char>_> *this_00;
  ostream *poVar4;
  vector<void_*,_std::allocator<void_*>_> *in_RDX;
  statHashKey_t *in_RDI;
  smatch m;
  regex regex;
  string backtraceSymbols;
  char *tmp;
  uint cnt;
  char **symbols;
  void **btpointer;
  uint64_t size;
  string tmpHash;
  string statHashKey;
  statHashKey_t *statHashKey_s;
  sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffe08;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> *in_stack_fffffffffffffe10;
  size_type in_stack_fffffffffffffe18;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> *in_stack_fffffffffffffe20;
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *in_stack_fffffffffffffe28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe30;
  const_reference in_stack_fffffffffffffe40;
  flag_type __f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe50;
  int in_stack_fffffffffffffe54;
  int local_11c;
  string local_118 [119];
  allocator local_a1;
  string local_a0 [32];
  char *local_80;
  uint local_74;
  char **local_70;
  reference local_68;
  ulong local_60;
  string local_58 [32];
  string local_38 [56];
  
  std::__cxx11::string::string(local_38);
  std::__cxx11::string::string(local_58);
  local_60 = std::vector<void_*,_std::allocator<void_*>_>::size(in_RDX);
  local_68 = std::vector<void_*,_std::allocator<void_*>_>::operator[](in_RDX,0);
  local_70 = (char **)backtrace_symbols(local_68,local_60 & 0xffffffff);
  local_74 = 3;
  local_80 = local_70[3];
  do {
    pcVar1 = local_80;
    __f = (flag_type)((ulong)in_stack_fffffffffffffe40 >> 0x20);
    if (local_80 == (char *)0x0 || local_60 <= local_74) break;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a0,pcVar1,&local_a1);
    std::allocator<char>::~allocator((allocator<char> *)&local_a1);
    if (((DebugFlag & 1U) != 0) &&
       (bVar2 = isCurrentDebugType((char *)in_stack_fffffffffffffe28), bVar2)) {
      poVar4 = std::operator<<((ostream *)&std::cerr,"backtraceSymbols: ");
      poVar4 = std::operator<<(poVar4,local_a0);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    }
    std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>::
    basic_regex<std::char_traits<char>,std::allocator<char>>
              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
               CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
               in_stack_fffffffffffffe48,__f);
    std::__cxx11::
    match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     *)in_stack_fffffffffffffe10);
    std::
    regex_match<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
              (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,
               (match_flag_type)(in_stack_fffffffffffffe18 >> 0x20));
    std::__cxx11::
    match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
    std::__cxx11::sub_match::operator_cast_to_string(in_stack_fffffffffffffe08);
    std::__cxx11::string::operator+=(local_38,local_118);
    std::__cxx11::string::~string(local_118);
    if (((DebugFlag & 1U) != 0) &&
       (bVar2 = isCurrentDebugType((char *)in_stack_fffffffffffffe28), bVar2)) {
      std::operator<<((ostream *)&std::cerr,"Function: ");
      std::__cxx11::
      match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
      this_00 = std::__cxx11::operator<<
                          ((basic_ostream<char,_std::char_traits<char>_> *)
                           CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                           (sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)in_stack_fffffffffffffe48);
      std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    }
    if (((DebugFlag & 1U) != 0) &&
       (bVar2 = isCurrentDebugType((char *)in_stack_fffffffffffffe28), bVar2)) {
      poVar4 = std::operator<<((ostream *)&std::cerr,"?main: ");
      std::__cxx11::
      match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
      in_stack_fffffffffffffe54 =
           std::__cxx11::
           sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::compare((sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_fffffffffffffe30,(value_type *)in_stack_fffffffffffffe28);
      in_stack_fffffffffffffe48 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::ostream::operator<<(poVar4,in_stack_fffffffffffffe54 == 0);
      std::ostream::operator<<(in_stack_fffffffffffffe48,std::endl<char,std::char_traits<char>>);
    }
    in_stack_fffffffffffffe40 =
         std::__cxx11::
         match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
         ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
    iVar3 = std::__cxx11::
            sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::compare((sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_fffffffffffffe30,(value_type *)in_stack_fffffffffffffe28);
    if (iVar3 == 0) {
      local_11c = 3;
    }
    else {
      local_74 = local_74 + 1;
      local_80 = local_70[local_74];
      local_11c = 0;
    }
    std::__cxx11::
    match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::~match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      *)0x1db3cb);
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
              (in_stack_fffffffffffffe10);
    std::__cxx11::string::~string(local_a0);
  } while (local_11c == 0);
  if (((DebugFlag & 1U) != 0) &&
     (bVar2 = isCurrentDebugType((char *)in_stack_fffffffffffffe28), bVar2)) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"__staticHashKey");
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x7b);
    poVar4 = std::operator<<(poVar4," staticHashKey: ");
    poVar4 = std::operator<<(poVar4,local_38);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  in_RDI->sym = local_70;
  std::__cxx11::string::string((string *)&in_RDI->hashKey,local_38);
  in_RDI->size = local_60;
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::~string(local_38);
  return in_RDI;
}

Assistant:

struct statHashKey_t Profile::__staticHashKey(vector<void*> btVec){
    string statHashKey;
    string tmpHash;
    uint64_t size = btVec.size();
    void ** btpointer = &btVec[0];
    char ** symbols = backtrace_symbols(btpointer, size);
    // Starting at 3 because backtrace inside PyFloT is not useful.
    unsigned int cnt = 3;
    char * tmp = symbols[cnt];
    while(NULL != tmp && cnt < size){
        string backtraceSymbols(tmp);
        DEBUG("statickey",cerr << "backtraceSymbols: " << backtraceSymbols << endl ;);
#ifndef MAC_OS // On Cori for e.g.
        // /path/to/binaryFile.exe(Mangl_D2_FUncName+0x2e) [0x2aaaaacf5ede]
        // /path/to/binaryFile.exe((group 1)+(group 2)) [(group 3)]
        regex regex(BACKTRACE_SYMBOLS_REGEX);
        smatch m;
        regex_match(backtraceSymbols, m, regex);
        // Get instruction pointer address
        statHashKey += m[3];
        DEBUG("statickey", cerr << "Function: " << m[1] << endl;);
        DEBUG("statickey", cerr << "?main: " << (m[1].compare("main")==0) << endl;);
        if(m[1].compare("main")==0)
            break;
#else// Mac OS environment
        std::vector<std::string> result;
        std::istringstream iss(backtraceSymbols);
        for(std::string s; iss >> s; ){
            DEBUG("statickey",cerr << s << " " ;);
            result.push_back(s);
        }
        DEBUG("statickey",cerr << endl << __FUNCTION__ << ":" << __LINE__
                << " Result size: "<< result.size() << endl;);
        DEBUG("statickey",cerr << " Elts chosen for static key: " <<endl << result[3]<< " " << result[5] << endl;);
        statHashKey += result[3];
        statHashKey += result[5];
        //If main function call is reached, stop the callstack unstacking.
        if(result[3].compare("main")==0)
            cnt=size;
#endif
        cnt++;
        tmp = symbols[cnt];
    }
    DEBUG("statickey",cerr << __FUNCTION__ << ":" << __LINE__
            << " staticHashKey: " << statHashKey << endl;);
    struct statHashKey_t statHashKey_s = {symbols, statHashKey, size};
    return statHashKey_s;
}